

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_pop_stack(Integer memhandle)

{
  AD *in_RAX;
  Boolean BVar1;
  AD *pAVar2;
  AD *ad;
  
  ma_stats.calls[0x14] = ma_stats.calls[0x14] + 1;
  ad = in_RAX;
  BVar1 = mh2ad(memhandle,&ad,BL_StackTop,"MA_pop_stack");
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else {
    if (ma_trace != 0) {
      printf("MA: popping \'%s\'\n",ad->name);
    }
    pAVar2 = list_delete(ad,&ma_sused);
    if (pAVar2 == ad) {
      ma_sp = ma_sp + ad->nbytes;
      ma_stats.sblocks = ma_stats.sblocks - 1;
      ma_stats.sbytes = ma_stats.sbytes - ad->nbytes;
      ma_table_deallocate(memhandle);
      BVar1 = 1;
    }
    else {
      BVar1 = 0;
      sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not on stack used list",memhandle,ad->name);
      ma_error(EL_Nonfatal,ET_Internal,"MA_pop_stack",ma_ebuf);
    }
  }
  return BVar1;
}

Assistant:

public Boolean MA_pop_stack(Integer memhandle) /* the block to deallocate */
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_pop_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_StackTop, "MA_pop_stack"))
        return MA_FALSE;

    if (ma_trace) 
    (void)printf("MA: popping '%s'\n", ad->name);

    /* delete block from used list */
    if (list_delete(ad, &ma_sused) != ad)
    {
        (void)sprintf(ma_ebuf,
            "memhandle %ld (name: '%s') not on stack used list",
            (size_t)memhandle, ad->name);
        ma_error(EL_Nonfatal, ET_Internal, "MA_pop_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* pop block from stack */
    ma_sp += ad->nbytes;

#ifdef STATS
    ma_stats.sblocks--;
    ma_stats.sbytes -= ad->nbytes;
#endif /* STATS */

    /* free memhandle */
    ma_table_deallocate(memhandle);

    /* success */
    return MA_TRUE;
}